

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::ExtensionGenerator::GenerateMembersHeader
          (ExtensionGenerator *this,Printer *printer)

{
  bool bVar1;
  long lVar2;
  string_view name;
  allocator<char> local_4bc;
  allocator<char> local_4bb;
  allocator<char> local_4ba;
  allocator<char> local_4b9;
  undefined1 *local_4b8;
  undefined8 local_4b0;
  undefined1 local_4a8 [8];
  undefined8 uStack_4a0;
  _Any_data local_498;
  code *local_488;
  code *pcStack_480;
  Printer *printer_local;
  string local_470;
  char *local_450;
  string local_448;
  string local_428;
  AnnotationRecord local_408;
  Sub local_3c8;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  variant<std::__cxx11::string,std::function<bool()>> local_2f0 [32];
  char local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  printer_local = printer;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"method_name",&local_4b9);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_e8,&local_428,&this->method_name_);
  io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::FieldDescriptor,_0>
            (&local_408,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  io::Printer::Sub::AnnotatedAs(&local_3c8,&local_e8,&local_408);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"comments",&local_4ba);
  local_310 = local_300;
  if (local_4b8 == local_4a8) {
    uStack_2f8 = uStack_4a0;
  }
  else {
    local_310 = local_4b8;
  }
  local_308 = local_4b0;
  local_4b0 = 0;
  local_4a8[0] = 0;
  local_488 = (code *)0x0;
  pcStack_480 = (code *)0x0;
  local_498._M_unused._M_object = (void *)0x0;
  local_498._8_8_ = 0;
  local_4b8 = local_4a8;
  local_498._M_unused._M_object = operator_new(0x18);
  *(Printer ***)local_498._M_unused._0_8_ = &printer_local;
  *(ExtensionGenerator **)((long)local_498._M_unused._0_8_ + 8) = this;
  *(code *)((long)local_498._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_480 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_488 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_2f0,(function<bool_()> *)&local_498);
  std::_Function_base::~_Function_base((_Function_base *)&local_498);
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  if (local_2d0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_2c8);
  }
  local_260 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"storage_attribute",&local_4bb);
  name._M_str = (this->method_name_)._M_dataplus._M_p;
  name._M_len = (this->method_name_)._M_string_length;
  bVar1 = IsRetainedName(name);
  local_450 = "";
  if (bVar1) {
    local_450 = "NS_RETURNS_NOT_RETAINED";
  }
  io::Printer::Sub::Sub<char_const*>(&local_258,&local_448,&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"deprecated_attribute",&local_4bc);
  GetOptionalDeprecatedAttribute<google::protobuf::FieldDescriptor>
            ((string *)&local_498,this->descriptor_,this->descriptor_->file_);
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_1a0,&local_470,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_498);
  io::Printer::Emit(printer,&local_3c8,4,0x78,
                    "\n        $comments$\n        + (GPBExtensionDescriptor *)$method_name$$ storage_attribute$$ deprecated_attribute$;\n      "
                   );
  lVar2 = 0x228;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_3c8.key_._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0xb8;
  } while (lVar2 != -0xb8);
  std::__cxx11::string::~string((string *)local_498._M_pod_data);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_4b8);
  io::Printer::AnnotationRecord::~AnnotationRecord(&local_408);
  io::Printer::Sub::~Sub(&local_e8);
  std::__cxx11::string::~string((string *)&local_428);
  return;
}

Assistant:

void ExtensionGenerator::GenerateMembersHeader(io::Printer* printer) const {
  printer->Emit(
      {Sub("method_name", method_name_).AnnotatedAs(descriptor_),
       {"comments",
        [&] { EmitCommentsString(printer, generation_options_, descriptor_); }},
       {"storage_attribute",
        IsRetainedName(method_name_) ? "NS_RETURNS_NOT_RETAINED" : ""},
       {"deprecated_attribute",
        // Unlike normal message fields, check if the file for the extension was
        // deprecated.
        GetOptionalDeprecatedAttribute(descriptor_, descriptor_->file())}},
      R"objc(
        $comments$
        + (GPBExtensionDescriptor *)$method_name$$ storage_attribute$$ deprecated_attribute$;
      )objc");
}